

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.cpp
# Opt level: O2

void __thiscall
psy::C::TypeCheckerTester::checkTypes(TypeCheckerTester *this,string *text,Expectation *X)

{
  InternalsTestSuite *this_00;
  string sStack_e8;
  Expectation local_c8;
  
  this_00 = (InternalsTestSuite *)(this->super_Tester).suite_;
  std::__cxx11::string::string((string *)&sStack_e8,(string *)text);
  Expectation::Expectation(&local_c8,X);
  InternalsTestSuite::checkTypes(this_00,&sStack_e8,&local_c8);
  Expectation::~Expectation(&local_c8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  return;
}

Assistant:

void TypeCheckerTester::checkTypes(std::string text, Expectation X)
{
    (static_cast<InternalsTestSuite*>(suite_)->checkTypes(text, X));
}